

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5BufferCompare(Fts5Buffer *pLeft,Fts5Buffer *pRight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = pLeft->n;
  iVar2 = pRight->n;
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  if ((iVar3 != 0) && (iVar3 = memcmp(pLeft->p,pRight->p,(long)iVar3), iVar3 != 0)) {
    return iVar3;
  }
  return iVar1 - iVar2;
}

Assistant:

static int fts5BufferCompare(Fts5Buffer *pLeft, Fts5Buffer *pRight){
  int nCmp = MIN(pLeft->n, pRight->n);
  int res = fts5Memcmp(pLeft->p, pRight->p, nCmp);
  return (res==0 ? (pLeft->n - pRight->n) : res);
}